

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall
sglr::GLContext::genFramebuffers(GLContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  long lVar1;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  glu::CallLogWrapper::glGenFramebuffers(this->m_wrapper,numFramebuffers,framebuffers);
  if (0 < numFramebuffers) {
    lVar1 = (ulong)(uint)numFramebuffers << 2;
    local_38._M_t = &(this->m_allocatedFbos)._M_t;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->m_allocatedFbos,
                 (const_iterator)&(this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header,
                 framebuffers,&local_38);
      framebuffers = framebuffers + 1;
      lVar1 = lVar1 + -4;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void GLContext::genFramebuffers (int numFramebuffers, deUint32* framebuffers)
{
	m_wrapper->glGenFramebuffers(numFramebuffers, framebuffers);
	if (numFramebuffers > 0)
		m_allocatedFbos.insert(framebuffers, framebuffers+numFramebuffers);
}